

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::AddMacOSXContentRule(cmGlobalNinjaGenerator *this)

{
  cmAlphaNum local_210;
  string local_1e0;
  cmAlphaNum local_1c0;
  string local_190;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  cmNinjaRule rule;
  cmGlobalNinjaGenerator *this_local;
  
  rule._288_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"COPY_OSX_CONTENT",&local_159);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  CMakeCmd_abi_cxx11_(&local_1e0,this);
  cmAlphaNum::cmAlphaNum(&local_1c0,&local_1e0);
  cmAlphaNum::cmAlphaNum(&local_210," -E copy $in $out");
  cmStrCat<>(&local_190,&local_1c0,&local_210);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"Copying OS X Content $out");
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),
             "Rule for copying OS X bundle content file.");
  AddRule(this,(cmNinjaRule *)local_138);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_138);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddMacOSXContentRule()
{
  cmNinjaRule rule("COPY_OSX_CONTENT");
  rule.Command = cmStrCat(this->CMakeCmd(), " -E copy $in $out");
  rule.Description = "Copying OS X Content $out";
  rule.Comment = "Rule for copying OS X bundle content file.";
  this->AddRule(rule);
}